

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double empirical_discrete_mean(int a,double *b,double *c)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  
  if (a < 1) {
    dVar3 = 0.0;
  }
  else {
    dVar3 = 0.0;
    uVar1 = 0;
    do {
      dVar3 = dVar3 + b[uVar1] * c[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)a != uVar1);
  }
  dVar2 = r8vec_sum(a,b);
  return dVar3 / dVar2;
}

Assistant:

double empirical_discrete_mean ( int a, double b[], double c[] )

//****************************************************************************80
//
//  Purpose:
//
//    EMPIRICAL_DISCRETE_MEAN returns the mean of the Empirical Discrete PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int A, the number of values.
//    0 < A.
//
//    Input, double B(A), the weights of each value.
//    0 <= B(1:A) and at least one value is nonzero.
//
//    Input, double C(A), the values.
//    The values must be distinct and in ascending order.
//
//    Output, double EMPIRICAL_DISCRETE_MEAN, the mean of the PDF.
//
{
  int i;
  double mean;

  mean = 0.0;
  for ( i = 0; i < a; i++ )
  {
    mean = mean + b[i] * c[i];
  }
  mean = mean / r8vec_sum ( a, b );

  return mean;
}